

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderErrors.cpp
# Opt level: O3

string * __thiscall
glcts::TessellationShaderError6::getTessellationControlShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,TessellationShaderError6 *this,uint n_program_object)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  ostream *poVar2;
  GLint gl_max_patch_vertices_value;
  string tc_code_layout_qualifier_string;
  stringstream tc_code_layout_qualifier_sstream;
  stringstream result;
  char *local_380;
  long local_378;
  char local_370;
  undefined7 uStack_36f;
  long *local_360 [2];
  long local_350 [2];
  stringstream local_340 [16];
  undefined1 local_330 [376];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  iVar1 = (*((this->super_TessellationShaderErrorsTestCaseBase).super_TestCaseBase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__cxx11::stringstream::stringstream(local_340);
  local_380 = &local_370;
  local_378 = 0;
  local_370 = '\0';
  if (n_program_object == 0) {
    std::__cxx11::string::_M_replace((ulong)&local_380,0,(char *)0x0,0x1b63207);
  }
  else {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x868))
              ((this->super_TessellationShaderErrorsTestCaseBase).super_TestCaseBase.m_glExtTokens.
               MAX_PATCH_VERTICES);
    err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
    glu::checkError(err,"glGetIntegerv() failed for GL_MAX_PATCH_VERTICES_EXT pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderErrors.cpp"
                    ,0x77b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_330,"layout (vertices = ",0x13);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_330,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") out;\n",7);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&local_380,(string *)local_360);
    if (local_360[0] != local_350) {
      operator_delete(local_360[0],local_350[0] + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"${VERSION}\n\n${TESSELLATION_SHADER_REQUIRE}\n\n",0x2c);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_380,local_378);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,
             "\nin vec4 test_input[];\n\nvoid main()\n{\n    gl_out[gl_InvocationID].gl_Position = test_input[0];\n    gl_TessLevelOuter[0]                = 1.0;\n    gl_TessLevelOuter[1]                = 1.0;\n}\n"
             ,0xbf);
  std::__cxx11::stringbuf::str();
  if (local_380 != &local_370) {
    operator_delete(local_380,CONCAT71(uStack_36f,local_370) + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_340);
  std::ios_base::~ios_base((ios_base *)(local_330 + 0x70));
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string TessellationShaderError6::getTessellationControlShaderCode(unsigned int n_program_object)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();
	std::stringstream	 result;
	const char*			  tc_code_preamble = "${VERSION}\n"
								   "\n"
								   "${TESSELLATION_SHADER_REQUIRE}\n"
								   "\n";
	const char* tc_code_body_excl_layout_qualifiers = "\n"
													  "in vec4 test_input[];\n"
													  "\n"
													  "void main()\n"
													  "{\n"
													  "    gl_out[gl_InvocationID].gl_Position = test_input[0];\n"
													  "    gl_TessLevelOuter[0]                = 1.0;\n"
													  "    gl_TessLevelOuter[1]                = 1.0;\n"
													  "}\n";

	/* Prepare the line with layout qualifier */
	std::stringstream tc_code_layout_qualifier_sstream;
	std::string		  tc_code_layout_qualifier_string;

	if (n_program_object == 0)
	{
		tc_code_layout_qualifier_string = "layout (vertices = 0) out;\n";
	}
	else
	{
		/* Retrieve GL_MAX_PATCH_VERTICES_EXT value first */
		glw::GLint gl_max_patch_vertices_value = 0;

		gl.getIntegerv(m_glExtTokens.MAX_PATCH_VERTICES, &gl_max_patch_vertices_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_PATCH_VERTICES_EXT pname");

		/* Construct the string */
		tc_code_layout_qualifier_sstream << "layout (vertices = " << (gl_max_patch_vertices_value + 1) << ") out;\n";

		tc_code_layout_qualifier_string = tc_code_layout_qualifier_sstream.str();
	}

	result << tc_code_preamble << tc_code_layout_qualifier_string << tc_code_body_excl_layout_qualifiers;

	return result.str();
}